

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  int iVar4;
  ImGuiWindow **__dest;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  __dest = this->Data;
  if (__dest <= it) {
    iVar2 = this->Size;
    lVar5 = (long)iVar2;
    if (it <= __dest + lVar5) {
      lVar7 = (long)it - (long)__dest;
      if (iVar2 == this->Capacity) {
        if (iVar2 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar2 / 2 + iVar2;
        }
        iVar8 = iVar2 + 1;
        if (iVar2 + 1 < iVar4) {
          iVar8 = iVar4;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
        if (this->Data != (ImGuiWindow **)0x0) {
          memcpy(__dest,this->Data,(long)this->Size << 3);
          ppIVar3 = this->Data;
          if ((ppIVar3 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
        }
        this->Data = __dest;
        this->Capacity = iVar8;
        lVar5 = (long)this->Size;
      }
      lVar6 = lVar5 - (lVar7 >> 3);
      if (lVar6 != 0 && lVar7 >> 3 <= lVar5) {
        memmove((void *)((long)__dest + lVar7 + 8),(void *)((long)__dest + lVar7),lVar6 * 8);
        __dest = this->Data;
      }
      *(ImGuiWindow **)((long)__dest + lVar7) = *v;
      this->Size = this->Size + 1;
      return (ImGuiWindow **)(lVar7 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                ,0x4f8,
                "T *ImVector<ImGuiWindow *>::insert(const T *, const T &) [T = ImGuiWindow *]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }